

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

void __thiscall AmpIO::InitWriteBuffer(AmpIO *this)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar3 < 8) {
    this->WB_CURR_OFFSET = 0;
    uVar2 = this->NumMotors;
    bVar1 = (this->super_FpgaIO).super_BoardIO.BoardId;
    this->WB_CTRL_OFFSET = uVar2;
    if ((ulong)uVar2 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        this->WriteBuffer[this->WB_CURR_OFFSET + uVar4] = (bVar1 & 0xf) << 0x18;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      uVar4 = (ulong)this->WB_CTRL_OFFSET;
    }
    this->WriteBuffer[uVar4] = 0;
  }
  else {
    this->WB_CURR_OFFSET = 1;
    uVar2 = this->NumMotors;
    this->WB_CTRL_OFFSET = uVar2 + 1;
    memset(this->WriteBuffer,0,0x100);
    this->WriteBuffer[this->WB_HEADER_OFFSET] =
         uVar2 + 2 & 0xff | ((this->super_FpgaIO).super_BoardIO.BoardId & 0xf) << 8;
  }
  return;
}

Assistant:

void AmpIO::InitWriteBuffer(void)
{
    if (GetFirmwareVersion() < 8) {
        WB_CURR_OFFSET = 0;
        WB_CTRL_OFFSET = WB_CURR_OFFSET + NumMotors;
        quadlet_t data = (BoardId & 0x0F) << 24;
        for (size_t i = 0; i < NumMotors; i++) {
            WriteBuffer[WB_CURR_OFFSET+i] = data;
        }
        WriteBuffer[WB_CTRL_OFFSET] = 0;
    } else {
        WB_CURR_OFFSET = 1;
        WB_CTRL_OFFSET = WB_CURR_OFFSET + NumMotors;
        //std::fill(std::begin(WriteBuffer), std::end(WriteBuffer), 0);
        memset(WriteBuffer, 0, sizeof(WriteBuffer));
        // Write buffer size = NumMotors+2 (quadlets)
        WriteBuffer[WB_HEADER_OFFSET] = (BoardId & 0x0F) << 8 | ((NumMotors+2) & 0xFF);
    }
}